

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

void narrow_bpc_set(jit_State *J,IRRef1 key,IRRef1 val,IRRef mode)

{
  BPropEntry *pBVar1;
  BPropEntry *bp;
  uint32_t slot;
  IRRef mode_local;
  IRRef1 val_local;
  IRRef1 key_local;
  jit_State *J_local;
  
  pBVar1 = J->bpropcache + J->bpropslot;
  J->bpropslot = J->bpropslot + 1 & 0xf;
  pBVar1->key = key;
  pBVar1->val = val;
  pBVar1->mode = mode;
  return;
}

Assistant:

static void narrow_bpc_set(jit_State *J, IRRef1 key, IRRef1 val, IRRef mode)
{
  uint32_t slot = J->bpropslot;
  BPropEntry *bp = &J->bpropcache[slot];
  J->bpropslot = (slot + 1) & (BPROP_SLOTS-1);
  bp->key = key;
  bp->val = val;
  bp->mode = mode;
}